

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_x86_64.cpp
# Opt level: O2

void __thiscall hdc::Generator_x86_64::emit(Generator_x86_64 *this,TAC *tac)

{
  ostream *poVar1;
  pointer pbVar2;
  char *pcVar3;
  string *this_00;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  switch(tac->kind) {
  case 0:
    poVar1 = std::operator<<((ostream *)&this->field_0x10,".");
    poVar1 = std::operator<<(poVar1,(string *)&tac->label);
    pcVar3 = ":";
    goto LAB_001658a9;
  default:
    poVar1 = (ostream *)&this->field_0x10;
    pcVar3 = "x86_64 gen ERROR: undefined tac";
LAB_001658a9:
    std::operator<<(poVar1,pcVar3);
    goto LAB_001658ae;
  case 3:
    this->regCounter = -1;
    goto LAB_001658ae;
  case 9:
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    movl ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    ((this->regs_s).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this->regCounter));
    std::operator<<(poVar1,", %ecx\n");
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    sall %cl, ");
    std::operator<<(poVar1,(string *)
                           ((this->regs_s).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)this->regCounter + -1)
                   );
    goto LAB_0016583c;
  case 10:
    std::__cxx11::string::string((string *)&local_38,"andl",&local_b9);
    emitInstruction(this,&local_38);
    this_00 = &local_38;
    break;
  case 0xb:
    std::__cxx11::string::string((string *)&local_58,"xorl",&local_b9);
    emitInstruction(this,&local_58);
    this_00 = &local_58;
    break;
  case 0xc:
    std::__cxx11::string::string((string *)&local_78,"orl",&local_b9);
    emitInstruction(this,&local_78);
    this_00 = &local_78;
    break;
  case 0xd:
    std::__cxx11::string::string((string *)&local_98,"addl",&local_b9);
    emitInstruction(this,&local_98);
    this_00 = &local_98;
    break;
  case 0xe:
    std::__cxx11::string::string((string *)&local_b8,"subl",&local_b9);
    emitInstruction(this,&local_b8);
    this_00 = &local_b8;
    break;
  case 0xf:
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    cmpl $0, ");
    std::operator<<(poVar1,(string *)
                           ((this->regs_s).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + this->regCounter));
    pcVar3 = "\n    je .";
    goto LAB_00165888;
  case 0x10:
    pcVar3 = "    jmp .";
LAB_00165888:
    poVar1 = std::operator<<((ostream *)&this->field_0x10,pcVar3);
    pbVar2 = &tac->label;
LAB_00165897:
    std::operator<<(poVar1,(string *)pbVar2);
    goto LAB_001658ae;
  case 0x11:
    this->regCounter = this->regCounter + 1;
    poVar1 = std::operator<<((ostream *)&this->field_0x10,"    mov $");
    poVar1 = std::operator<<(poVar1,(string *)&tac->label);
    poVar1 = std::operator<<(poVar1,", ");
    pbVar2 = (this->regs_s).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->regCounter;
    goto LAB_00165897;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0016583c:
  this->regCounter = this->regCounter + -1;
LAB_001658ae:
  std::operator<<((ostream *)&this->field_0x10,'\n');
  return;
}

Assistant:

void hdc::Generator_x86_64::emit(TAC& tac) {
    switch (tac.kind) {
    case TAC_LABEL:
        output << "." << tac.label << ":";
        break;

    case TAC_END_EXPR:
        regCounter = -1;
        break;

    case TAC_SLL:
        output << "    movl " << regs_s[regCounter] <<", %ecx\n";
        output << "    sall %cl, " << regs_s[regCounter - 1];
        --regCounter;
        break;

    case TAC_BITWISE_AND:
        emitInstruction("andl");
        --regCounter;
        break;

    case TAC_BITWISE_XOR:
        emitInstruction("xorl");
        --regCounter;
        break;

    case TAC_BITWISE_OR:
        emitInstruction("orl");
        --regCounter;
        break;

    case TAC_ADD:
        emitInstruction("addl");
        --regCounter;
        break;

    case TAC_SUB:
        emitInstruction("subl");
        --regCounter;
        break;

    case TAC_IFZ:
        output << "    cmpl $0, " << regs_s[regCounter];
        output << "\n    je ." << tac.label;
        break;

    case TAC_GOTO:
        output << "    jmp ." << tac.label;
        break;

    case TAC_CONST_I32:
        ++regCounter;
        output << "    mov $" << tac.label << ", " << regs_s[regCounter];
        break;

    default:
        output << "x86_64 gen ERROR: undefined tac";
        break;
    }

    output << '\n';
}